

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_expire(Curl_easy *data,time_t milli,expire_id id)

{
  Curl_multi *pCVar1;
  timeval *stamp;
  time_t tVar2;
  Curl_tree *pCVar3;
  timeval tVar4;
  time_t diff;
  long local_50;
  undefined1 local_48 [8];
  timeval set;
  int rc;
  timeval *nowp;
  Curl_multi *multi;
  expire_id id_local;
  time_t milli_local;
  Curl_easy *data_local;
  
  pCVar1 = data->multi;
  stamp = &(data->state).expiretime;
  if (pCVar1 != (Curl_multi *)0x0) {
    tVar4 = curlx_tvnow();
    diff = tVar4.tv_sec;
    local_50 = tVar4.tv_usec;
    local_48 = (undefined1  [8])(milli / 1000 + diff);
    set.tv_sec = (milli % 1000) * 1000 + local_50;
    if (999999 < set.tv_sec) {
      local_48 = (undefined1  [8])((long)local_48 + 1);
      set.tv_sec = set.tv_sec + -1000000;
    }
    if ((stamp->tv_sec != 0) || ((data->state).expiretime.tv_usec != 0)) {
      tVar4.tv_usec = set.tv_sec;
      tVar4.tv_sec = (__time_t)local_48;
      tVar2 = curlx_tvdiff(tVar4,*stamp);
      multi_deltimeout(data,id);
      if (0 < tVar2) {
        multi_addtimeout(data,(timeval *)local_48,id);
        return;
      }
      multi_addtimeout(data,stamp,id);
      set.tv_usec._4_4_ =
           Curl_splayremovebyaddr(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
      if (set.tv_usec._4_4_ != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)set.tv_usec._4_4_);
      }
    }
    stamp->tv_sec = (__time_t)local_48;
    (data->state).expiretime.tv_usec = set.tv_sec;
    (data->state).timenode.payload = data;
    pCVar3 = Curl_splayinsert(*stamp,pCVar1->timetree,&(data->state).timenode);
    pCVar1->timetree = pCVar3;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, time_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct timeval *nowp = &data->state.expiretime;
  int rc;
  struct timeval set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_tvnow();
  set.tv_sec += (long)(milli/1000);
  set.tv_usec += (long)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    time_t diff = curlx_tvdiff(set, *nowp);

    /* remove the previous timer first, if there */
    multi_deltimeout(data, id);

    if(diff > 0) {
      /* the new expire time was later so just add it to the queue
         and get out */
      multi_addtimeout(data, &set, id);
      return;
    }

    /* the new time is newer than the presently set one, so add the current
       to the queue and update the head */
    multi_addtimeout(data, nowp, id);

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}